

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionProxy::HasValidProfileEntryPoint(FunctionProxy *this)

{
  JavascriptMethod codeAddress;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  FunctionInfo *this_00;
  
  this_00 = (this->functionInfo).ptr;
  codeAddress = (JavascriptMethod)((this->m_defaultEntryPointInfo).ptr)->jsMethod;
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00765156;
    *puVar4 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  if ((this_00->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_00765156;
    *puVar4 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  p_Var5 = FunctionInfo::GetOriginalEntryPoint_Unchecked(this_00);
  if (p_Var5 == JavascriptFunction::DeferredParsingThunk) {
    bVar2 = codeAddress == ScriptContext::ProfileModeDeferredParsingThunk;
  }
  else if (p_Var5 == JavascriptFunction::DeferredDeserializeThunk) {
    bVar2 = codeAddress == ScriptContext::ProfileModeDeferredDeserializeThunk;
  }
  else {
    bVar2 = IsFunctionBody(this);
    if (bVar2) {
      bVar2 = IsFunctionBody(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar2) {
LAB_00765156:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      BVar3 = FunctionBody::IsInterpreterThunk((FunctionBody *)this);
      if ((BVar3 != 0) ||
         (bVar2 = FunctionBody::IsSimpleJitOriginalEntryPoint((FunctionBody *)this), bVar2)) {
        if (codeAddress != ScriptContext::DebugProfileProbeThunk) {
          BVar3 = IsIntermediateCodeGenThunk(codeAddress);
          return BVar3 != 0;
        }
        return true;
      }
      BVar3 = FunctionBody::IsNativeOriginalEntryPoint((FunctionBody *)this);
      if (BVar3 != 0) {
        return codeAddress == ScriptContext::DebugProfileProbeThunk ||
               codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FunctionProxy::HasValidProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        if (originalEntryPoint == DefaultDeferredParsingThunk)
        {
            return directEntryPoint == ProfileDeferredParsingThunk;
        }
        if (originalEntryPoint == DefaultDeferredDeserializeThunk)
        {
            return directEntryPoint == ProfileDeferredDeserializeThunk;
        }
        if (!this->IsFunctionBody())
        {
            return false;
        }

#if ENABLE_PROFILE_INFO
        FunctionBody * functionBody = this->GetFunctionBody();
        if (functionBody->IsInterpreterThunk() || functionBody->IsSimpleJitOriginalEntryPoint())
        {
            return directEntryPoint == ProfileEntryThunk || IsIntermediateCodeGenThunk(directEntryPoint);
        }

#if ENABLE_NATIVE_CODEGEN
        // In the profiler mode, the EnsureDynamicProfileInfoThunk is valid as we would be assigning to appropriate thunk when that thunk called.
        return functionBody->IsNativeOriginalEntryPoint() &&
            (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk || directEntryPoint == ProfileEntryThunk);
#endif
#else
        return true;
#endif
    }